

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::DescriptorBuilder::AddTwiceListedError
          (DescriptorBuilder *this,FileDescriptorProto *proto,int index)

{
  FileDescriptorProto *descriptor;
  string *element_name;
  string *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  int local_1c;
  FileDescriptorProto *pFStack_18;
  int index_local;
  FileDescriptorProto *proto_local;
  DescriptorBuilder *this_local;
  
  local_1c = index;
  pFStack_18 = proto;
  proto_local = (FileDescriptorProto *)this;
  element_name = FileDescriptorProto::name_abi_cxx11_(proto);
  descriptor = pFStack_18;
  __rhs = FileDescriptorProto::dependency_abi_cxx11_(pFStack_18,local_1c);
  std::operator+(&local_60,"Import \"",__rhs);
  std::operator+(&local_40,&local_60,"\" was listed twice.");
  AddError(this,element_name,&descriptor->super_Message,OTHER,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  return;
}

Assistant:

void DescriptorBuilder::AddTwiceListedError(const FileDescriptorProto& proto,
                                            int index) {
  AddError(proto.name(), proto, DescriptorPool::ErrorCollector::OTHER,
           "Import \"" + proto.dependency(index) + "\" was listed twice.");
}